

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

void __thiscall glslang::TSymbol::setExtensions(TSymbol *this,int numExts,char **exts)

{
  vector<char_const*,glslang::pool_allocator<char_const*>> *this_00;
  iterator __position;
  TPoolAllocator *pTVar1;
  TExtensionList *pTVar2;
  ulong uVar3;
  
  if (this->extensions != (TExtensionList *)0x0) {
    __assert_fail("extensions == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                  ,0x70,"virtual void glslang::TSymbol::setExtensions(int, const char *const *)");
  }
  uVar3 = (ulong)(uint)numExts;
  if (0 < numExts) {
    pTVar1 = GetThreadPoolAllocator();
    pTVar2 = (TExtensionList *)TPoolAllocator::allocate(pTVar1,0x20);
    (pTVar2->super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>).
    super__Vector_base<const_char_*,_glslang::pool_allocator<const_char_*>_>._M_impl.
    super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
    (pTVar2->super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>).
    super__Vector_base<const_char_*,_glslang::pool_allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar2->super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>).
    super__Vector_base<const_char_*,_glslang::pool_allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar2->super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>).
    super__Vector_base<const_char_*,_glslang::pool_allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar1 = GetThreadPoolAllocator();
    (pTVar2->super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>).
    super__Vector_base<const_char_*,_glslang::pool_allocator<const_char_*>_>._M_impl.
    super__Tp_alloc_type.allocator = pTVar1;
    (pTVar2->super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>).
    super__Vector_base<const_char_*,_glslang::pool_allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar2->super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>).
    super__Vector_base<const_char_*,_glslang::pool_allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar2->super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>).
    super__Vector_base<const_char_*,_glslang::pool_allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->extensions = pTVar2;
    do {
      this_00 = (vector<char_const*,glslang::pool_allocator<char_const*>> *)this->extensions;
      __position._M_current = *(char ***)(this_00 + 0x10);
      if (__position._M_current == *(char ***)(this_00 + 0x18)) {
        std::vector<char_const*,glslang::pool_allocator<char_const*>>::
        _M_realloc_insert<char_const*const&>(this_00,__position,exts);
      }
      else {
        *__position._M_current = *exts;
        *(long *)(this_00 + 0x10) = *(long *)(this_00 + 0x10) + 8;
      }
      exts = exts + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    return;
  }
  __assert_fail("numExts > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,0x71,"virtual void glslang::TSymbol::setExtensions(int, const char *const *)");
}

Assistant:

virtual void setExtensions(int numExts, const char* const exts[])
    {
        assert(extensions == nullptr);
        assert(numExts > 0);
        extensions = NewPoolObject(extensions);
        for (int e = 0; e < numExts; ++e)
            extensions->push_back(exts[e]);
    }